

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
* __thiscall
ising::dos::square::finite<128u,100u,int>
          (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           *__return_storage_ptr__,square *this,uint_t m,uint_t n)

{
  long *plVar1;
  long *plVar2;
  _anonymous_namespace_ *p_Var3;
  data_type *pdVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  undefined4 *puVar16;
  undefined1 *puVar17;
  limb_type *plVar18;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_00;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  *x_01;
  undefined8 uVar19;
  long lVar20;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  *this_00;
  policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  ulong uVar21;
  data_type *pdVar22;
  uint j;
  uint uVar23;
  square *psVar24;
  bool bVar25;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  *dos;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  zmn;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  sum;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z4;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z3;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z2;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  z1;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  x;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xmo;
  autodiff_fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>,_128UL>
  xpo;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ak;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  beta_m;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  sn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  cn;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  s0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  c0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  beta;
  ulong uStack_37798;
  limb_type *plStack_37790;
  uint uStack_37788;
  undefined1 uStack_37784;
  char cStack_37783;
  char cStack_37782;
  ulong uStack_37770;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  nStack_37768;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_37718;
  undefined1 auStack_34ec8 [8];
  limb_type *plStack_34ec0;
  undefined8 uStack_34eb8;
  uint auStack_34eb0 [9];
  undefined3 uStack_34e8b;
  undefined5 uStack_34e88;
  undefined8 uStack_34e80;
  data_type dStack_32678;
  undefined8 uStack_32668;
  undefined8 uStack_32660;
  undefined8 uStack_32658;
  undefined8 uStack_32650;
  undefined8 uStack_32648;
  undefined8 uStack_32640;
  undefined4 uStack_32638;
  undefined1 uStack_32634;
  undefined8 uStack_32630;
  undefined1 auStack_2fe28 [16];
  uint uStack_2fe18;
  undefined2 uStack_2fe14;
  char cStack_2fe12;
  undefined8 auStack_2d620 [8];
  undefined4 uStack_2d5e0;
  undefined1 auStack_2d5dc [4];
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_2d5d8;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_2ad88;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_28538;
  undefined1 auStack_25ce8 [10320];
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_23498;
  cpp_dec_float<100U,_int,_void> acStack_20c48 [128];
  undefined8 auStack_1e444 [7];
  undefined8 uStack_1e407;
  undefined1 auStack_1e3fc [10248];
  undefined8 auStack_1bbf4 [7];
  undefined8 uStack_1bbb7;
  undefined1 auStack_1bbac [10324];
  cpp_dec_float<100U,_int,_void> acStack_19358 [129];
  undefined1 auStack_16b00 [16];
  type_conflict5 tStack_16af0;
  type_conflict5 tStack_16ae8;
  undefined1 auStack_142b0 [10320];
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  fStack_11a60;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_f210;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_c9c0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_a170;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_7920;
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  local_50d0;
  promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
  local_2880;
  
  lVar15 = *(long *)(std::cout + -0x18);
  *(undefined8 *)(&std::bad_alloc::typeinfo + lVar15) = 0x80;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&fStack_37718,0,(type *)0x0);
  uVar13 = (uint)lVar15;
  lVar15 = 0x4c;
  do {
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x284c) = 0x1000000000;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x2804) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x280c) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x2814) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x281c) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x2824) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x282c) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x2834) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x283c) = 0;
    *(undefined8 *)(auStack_25ce8 + lVar15 + 0x2841) = 0;
    lVar15 = lVar15 + 0x50;
  } while (lVar15 != 0x289c);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::
  fvar_cpp11<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
              *)&fStack_23498,&fStack_37718,1);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&fStack_37718,-1,(type *)0x0);
  lVar15 = 0x4c;
  do {
    *(undefined8 *)(auStack_1bbac + lVar15) = 0x1000000000;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 8) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 0x18) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 0x20) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 0x28) = 0;
    *(undefined8 *)((long)auStack_1bbf4 + lVar15 + 0x30) = 0;
    *(undefined8 *)(&stack0xfffffffffffe4444 + lVar15) = 0;
    *(undefined8 *)((long)&uStack_1bbb7 + lVar15) = 0;
    lVar15 = lVar15 + 0x50;
  } while (lVar15 != 0x289c);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::
  fvar_cpp11<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
              *)(auStack_1bbac + 4),&fStack_37718,1);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&fStack_37718,1,(type *)0x0);
  lVar15 = 0x4c;
  do {
    *(undefined8 *)(auStack_1e3fc + lVar15) = 0x1000000000;
    *(undefined8 *)((long)auStack_1e444 + lVar15) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 8) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 0x18) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 0x20) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 0x28) = 0;
    *(undefined8 *)((long)auStack_1e444 + lVar15 + 0x30) = 0;
    *(undefined8 *)(&stack0xfffffffffffe1bf4 + lVar15) = 0;
    *(undefined8 *)((long)&uStack_1e407 + lVar15) = 0;
    lVar15 = lVar15 + 0x50;
  } while (lVar15 != 0x289c);
  p_Var3 = (_anonymous_namespace_ *)(auStack_1e3fc + 4);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::
  fvar_cpp11<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
              *)p_Var3,&fStack_37718,1);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<100U,_int,_void> *)&dStack_32678.ld,2,(type *)0x0);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_34ec8,&fStack_23498,(root_type *)&dStack_32678.ld);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)auStack_34ec8,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)(auStack_1bbac + 4));
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&local_50d0,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)p_Var3);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&fStack_11a60,(_anonymous_namespace_ *)&local_50d0,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&fStack_37718,p_Var3,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&dStack_32678.ld,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_23498,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)(auStack_1bbac + 4));
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)auStack_34ec8,(_anonymous_namespace_ *)&dStack_32678.ld,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&local_7920,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_34ec8);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&fStack_37718,p_Var3,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  p_Var3 = (_anonymous_namespace_ *)(auStack_1bbac + 4);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&dStack_32678.ld,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_23498,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)p_Var3);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)auStack_34ec8,(_anonymous_namespace_ *)&dStack_32678.ld,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(&local_a170,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_34ec8);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&fStack_37718,p_Var3,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&dStack_32678.ld,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_23498,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)(auStack_1e3fc + 4));
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)auStack_34ec8,(_anonymous_namespace_ *)&dStack_32678.ld,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&local_c9c0,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_34ec8);
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            (&fStack_37718,p_Var3,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&dStack_32678.ld,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_23498,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)(auStack_1e3fc + 4));
  (anonymous_namespace)::
  power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
            ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)auStack_34ec8,(_anonymous_namespace_ *)&dStack_32678.ld,
             (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
              *)((ulong)this & 0xffffffff),uVar13);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator-(&local_f210,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_34ec8);
  fStack_37718.v._M_elems[0].m_backend.fpclass = cpp_dec_float_finite;
  fStack_37718.v._M_elems[0].m_backend.prec_elem = 0x10;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[1] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[2] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[3] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[4] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[5] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[6] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[7] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[8] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[9] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[10] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xb] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xc] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xd] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems._56_5_ = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xf]._1_3_ = 0;
  fStack_37718.v._M_elems[0].m_backend.exp = 0;
  fStack_37718.v._M_elems[0].m_backend.neg = false;
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
               *)auStack_25ce8,&fStack_23498,(root_type *)&fStack_37718);
  fStack_37718.v._M_elems[0].m_backend.fpclass = cpp_dec_float_finite;
  fStack_37718.v._M_elems[0].m_backend.prec_elem = 0x10;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[1] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[2] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[3] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[4] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[5] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[6] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[7] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[8] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[9] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[10] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xb] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xc] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xd] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems._56_5_ = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xf]._1_3_ = 0;
  fStack_37718.v._M_elems[0].m_backend.exp = 0;
  fStack_37718.v._M_elems[0].m_backend.neg = false;
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*(&fStack_28538,&fStack_23498,(root_type *)&fStack_37718);
  fStack_37718.v._M_elems[0].m_backend.fpclass = cpp_dec_float_finite;
  fStack_37718.v._M_elems[0].m_backend.prec_elem = 0x10;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[1] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[2] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[3] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[4] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[5] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[6] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[7] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[8] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[9] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[10] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xb] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xc] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xd] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems._56_5_ = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xf]._1_3_ = 0;
  fStack_37718.v._M_elems[0].m_backend.exp = 0;
  fStack_37718.v._M_elems[0].m_backend.neg = false;
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*(&fStack_2ad88,&fStack_23498,(root_type *)&fStack_37718);
  fStack_37718.v._M_elems[0].m_backend.fpclass = cpp_dec_float_finite;
  fStack_37718.v._M_elems[0].m_backend.prec_elem = 0x10;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[1] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[2] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[3] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[4] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[5] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[6] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[7] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[8] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[9] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[10] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xb] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xc] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xd] = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems._56_5_ = 0;
  fStack_37718.v._M_elems[0].m_backend.data._M_elems[0xf]._1_3_ = 0;
  fStack_37718.v._M_elems[0].m_backend.exp = 0;
  fStack_37718.v._M_elems[0].m_backend.neg = false;
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
  ::operator*(&fStack_2d5d8,&fStack_23498,(root_type *)&fStack_37718);
  if ((m & 1) == 0) {
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)auStack_34ec8,(_anonymous_namespace_ *)&fStack_23498,x_00);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&dStack_32678.ld,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)auStack_34ec8,(root_type *)&dStack_32678.ld);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x10) = uVar10;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x28) = uVar8;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x20) = uVar9;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x38) = uVar6;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x30) = uVar7;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x48) = uVar19;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x40) = uVar5;
      *(undefined4 *)(auStack_25ce8 + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      auStack_25ce8[lVar15 + -4] =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)(auStack_25ce8 + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    (anonymous_namespace)::
    one<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
              ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                *)auStack_34ec8,(_anonymous_namespace_ *)&fStack_23498,x_01);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&dStack_32678.ld,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                 *)auStack_34ec8,(root_type *)&dStack_32678.ld);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x10) =
           uVar10;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x28) =
           uVar8;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x20) =
           uVar9;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x38) =
           uVar6;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x30) =
           uVar7;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x48) =
           uVar19;
      *(undefined8 *)
       ((long)(&fStack_28538.v._M_elems[0].m_backend.data + 0xffffffffffffffff) + lVar15) = uVar5;
      *(undefined4 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      *(undefined1 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -4) =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)auStack_34ec8,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&local_7920,&local_c9c0);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&dStack_32678.ld,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,
                (promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)auStack_34ec8,(root_type *)&dStack_32678.ld);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x10) =
           uVar10;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x28) =
           uVar8;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x20) =
           uVar9;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x38) =
           uVar6;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x30) =
           uVar7;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x48) =
           uVar19;
      *(undefined8 *)
       ((long)(&fStack_2ad88.v._M_elems[0].m_backend.data + 0xffffffffffffffff) + lVar15) = uVar5;
      *(undefined4 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      *(undefined1 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -4) =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
    ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)auStack_34ec8,
                (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                 *)&local_a170,&local_f210);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)&dStack_32678.ld,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,
                (promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                 *)auStack_34ec8,(root_type *)&dStack_32678.ld);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x30) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x38) = uVar10;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x20) = uVar8;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x28) = uVar9;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x10) = uVar6;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x18) = uVar7;
      *(undefined8 *)((long)auStack_2d620 + lVar15) = uVar19;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 8) = uVar5;
      *(undefined4 *)((long)&uStack_2d5e0 + lVar15) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      auStack_2d5dc[lVar15] =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      puVar17 = *(undefined1 **)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      *(undefined1 **)((long)fStack_2d5d8.v._M_elems[0].m_backend.data._M_elems + lVar15) = puVar17;
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)auStack_34ec8,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,&local_c9c0,(root_type *)auStack_34ec8);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x10) = uVar10;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x28) = uVar8;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x20) = uVar9;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x38) = uVar6;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x30) = uVar7;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x48) = uVar19;
      *(undefined8 *)(auStack_25ce8 + lVar15 + -0x40) = uVar5;
      *(undefined4 *)(auStack_25ce8 + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      auStack_25ce8[lVar15 + -4] =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)(auStack_25ce8 + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)auStack_34ec8,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,&local_f210,(root_type *)auStack_34ec8);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x10) =
           uVar10;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x28) =
           uVar8;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x20) =
           uVar9;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x38) =
           uVar6;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x30) =
           uVar7;
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x48) =
           uVar19;
      *(undefined8 *)
       ((long)(&fStack_28538.v._M_elems[0].m_backend.data + 0xffffffffffffffff) + lVar15) = uVar5;
      *(undefined4 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      *(undefined1 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15 + -4) =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)((long)fStack_28538.v._M_elems[0].m_backend.data._M_elems + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)auStack_34ec8,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,&local_7920,(root_type *)auStack_34ec8);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x18) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x10) =
           uVar10;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x28) =
           uVar8;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x20) =
           uVar9;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x38) =
           uVar6;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x30) =
           uVar7;
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -0x48) =
           uVar19;
      *(undefined8 *)
       ((long)(&fStack_2ad88.v._M_elems[0].m_backend.data + 0xffffffffffffffff) + lVar15) = uVar5;
      *(undefined4 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -8) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      *(undefined1 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15 + -4) =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      *(undefined8 *)((long)fStack_2ad88.v._M_elems[0].m_backend.data._M_elems + lVar15) =
           *(undefined8 *)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)auStack_34ec8,2,(type *)0x0);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
    ::operator/(&fStack_37718,&local_a170,(root_type *)auStack_34ec8);
    lVar15 = 0x48;
    do {
      uVar19 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 8);
      uVar5 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x10);
      uVar6 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x18);
      uVar7 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x20);
      uVar8 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x28);
      uVar9 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x30);
      uVar10 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15);
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x30) =
           *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar15 + 0x38);
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x38) = uVar10;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x20) = uVar8;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x28) = uVar9;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x10) = uVar6;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 0x18) = uVar7;
      *(undefined8 *)((long)auStack_2d620 + lVar15) = uVar19;
      *(undefined8 *)((long)auStack_2d620 + lVar15 + 8) = uVar5;
      *(undefined4 *)((long)&uStack_2d5e0 + lVar15) =
           *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 8);
      auStack_2d5dc[lVar15] =
           *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar15 + 0xc);
      puVar17 = *(undefined1 **)((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15);
      *(undefined1 **)((long)fStack_2d5d8.v._M_elems[0].m_backend.data._M_elems + lVar15) = puVar17;
      lVar15 = lVar15 + 0x50;
    } while (lVar15 != 0x2898);
  }
  iVar12 = (int)this;
  if (1 < m) {
    uVar13 = iVar12 - 1;
    uVar21 = 1;
    do {
      uVar23 = (uint)puVar17;
      uStack_37770 = uVar21;
      if ((boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result == '\0') &&
         (iVar14 = __cxa_guard_acquire(&boost::math::constants::detail::
                                        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                                        ::get_from_string()::result), iVar14 != 0)) {
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._72_8_ = 0x1000000000;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._0_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._8_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._16_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._24_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._32_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._40_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._48_8_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._56_5_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._61_3_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result._64_4_ = 0;
        boost::math::constants::detail::
        constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
        ::get_from_string()::result[0x44] = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
                  ((cpp_dec_float<100U,_int,_void> *)
                   boost::math::constants::detail::
                   constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                   ::get_from_string()::result,
                   "3.14159265358979323846264338327950288419716939937510582097494459230781640628620899862803482534211706798214808651e+00"
                  );
        __cxa_guard_release(&boost::math::constants::detail::
                             constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                             ::get_from_string()::result);
      }
      acStack_20c48[0].data._M_elems[0xf]._1_3_ =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._61_3_;
      acStack_20c48[0].data._M_elems._56_5_ =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._56_5_;
      acStack_20c48[0].data._M_elems[0xc] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._48_4_;
      acStack_20c48[0].data._M_elems[0xd] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._52_4_;
      acStack_20c48[0].data._M_elems[8] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._32_4_;
      acStack_20c48[0].data._M_elems[9] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._36_4_;
      acStack_20c48[0].data._M_elems[10] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._40_4_;
      acStack_20c48[0].data._M_elems[0xb] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._44_4_;
      acStack_20c48[0].data._M_elems[4] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._16_4_;
      acStack_20c48[0].data._M_elems[5] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._20_4_;
      acStack_20c48[0].data._M_elems[6] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._24_4_;
      acStack_20c48[0].data._M_elems[7] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._28_4_;
      acStack_20c48[0].data._M_elems[0] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._0_4_;
      acStack_20c48[0].data._M_elems[1] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._4_4_;
      acStack_20c48[0].data._M_elems[2] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._8_4_;
      acStack_20c48[0].data._M_elems[3] =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._12_4_;
      acStack_20c48[0].exp =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._64_4_;
      acStack_20c48[0].neg =
           (bool)boost::math::constants::detail::
                 constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                 ::get_from_string()::result[0x44];
      acStack_20c48[0].fpclass =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._72_4_;
      acStack_20c48[0].prec_elem =
           boost::math::constants::detail::
           constant_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
           ::get_from_string()::result._76_4_;
      acStack_19358[0].fpclass = cpp_dec_float_finite;
      acStack_19358[0].prec_elem = 0x10;
      acStack_19358[0].data._M_elems[0] = 0;
      acStack_19358[0].data._M_elems[1] = 0;
      acStack_19358[0].data._M_elems[2] = 0;
      acStack_19358[0].data._M_elems[3] = 0;
      acStack_19358[0].data._M_elems[4] = 0;
      acStack_19358[0].data._M_elems[5] = 0;
      acStack_19358[0].data._M_elems[6] = 0;
      acStack_19358[0].data._M_elems[7] = 0;
      acStack_19358[0].data._M_elems[8] = 0;
      acStack_19358[0].data._M_elems[9] = 0;
      acStack_19358[0].data._M_elems[10] = 0;
      acStack_19358[0].data._M_elems[0xb] = 0;
      acStack_19358[0].data._M_elems[0xc] = 0;
      acStack_19358[0].data._M_elems[0xd] = 0;
      acStack_19358[0].data._M_elems._56_5_ = 0;
      psVar24 = (square *)0x0;
      acStack_19358[0].data._M_elems[0xf]._1_3_ = 0;
      acStack_19358[0].exp = 0;
      acStack_19358[0].neg = false;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::from_unsigned_long_long
                (acStack_19358,1);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                   *)&dStack_32678.ld,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&fStack_23498,&fStack_23498);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator+((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)auStack_34ec8,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)&dStack_32678.ld,(root_type *)acStack_19358);
      (anonymous_namespace)::
      power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                (&fStack_37718,(_anonymous_namespace_ *)auStack_34ec8,
                 (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                  *)0x2,uVar23);
      auStack_16b00._8_8_ = acStack_20c48;
      tStack_16af0 = (type_conflict5)uStack_37770;
      auStack_16b00._0_8_ = (type)auStack_2fe28;
      tStack_16ae8 = (type_conflict5)m;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointcos_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>,unsigned_int,void,void>,void,void>
                ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_2880,
                 (expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointcos_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>,_unsigned_int,_void,_void>,_void,_void>
                  *)auStack_16b00,(type *)0x0);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)auStack_2fe28,&local_50d0,(root_type *)&local_2880);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator-((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                   *)auStack_142b0,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&fStack_37718,
                  (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                   *)auStack_2fe28);
      uStack_34e80._0_4_ = cpp_dec_float_finite;
      uStack_34e80._4_4_ = 0x10;
      auStack_34ec8 = (undefined1  [8])0x0;
      plStack_34ec0 = (limb_type *)0x0;
      uStack_34eb8._0_4_ = 0;
      uStack_34eb8._4_4_ = 0;
      auStack_34eb0[0] = 0;
      auStack_34eb0[1] = 0;
      auStack_34eb0[2] = 0;
      auStack_34eb0[3] = 0;
      auStack_34eb0[4] = 0;
      auStack_34eb0[5] = 0;
      auStack_34eb0[6] = 0;
      auStack_34eb0[7] = 0;
      stack0xfffffffffffcb170 = 0;
      uStack_34e8b = 0;
      uStack_34e88._0_4_ = 0;
      uStack_34e88._4_1_ = false;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
      ::operator*(&fStack_37718,&fStack_23498,(root_type *)auStack_34ec8);
      do {
        uVar23 = (uint)psVar24;
        puVar17 = auStack_34ec8;
        boost::math::
        binomial_coefficient<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  (&nStack_37768,(math *)((ulong)this & 0xffffffff),uVar23,(uint)puVar17,in_R8);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)acStack_19358,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)auStack_142b0,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_142b0);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator*(&local_2880,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&local_50d0,&local_50d0);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator-((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)acStack_20c48,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)acStack_19358,&local_2880);
        (anonymous_namespace)::
        power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                  ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)auStack_2fe28,(_anonymous_namespace_ *)acStack_20c48,
                   (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)((ulong)psVar24 >> 1),(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
        ::operator*((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_2fe28,&nStack_37768);
        (anonymous_namespace)::
        power_n<boost::math::differentiation::autodiff_v1::detail::fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>>
                  ((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)auStack_16b00,(_anonymous_namespace_ *)auStack_142b0,
                   (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                    *)(ulong)(iVar12 - uVar23),(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator*((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)auStack_34ec8,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_16b00);
        lVar15 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)
                     ((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar15),
                     (cpp_dec_float<100U,_int,_void> *)(auStack_34ec8 + lVar15));
          uVar21 = uStack_37770;
          lVar15 = lVar15 + 0x50;
        } while (lVar15 != 0x2850);
        psVar24 = (square *)(ulong)(uVar23 + 2);
      } while (psVar24 <= this);
      if ((uStack_37770 & 1) == 0) {
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator+((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&fStack_37718,&fStack_11a60);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (acStack_20c48,2,(type *)0x0);
        (anonymous_namespace)::
        power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)auStack_2fe28,(_anonymous_namespace_ *)acStack_20c48,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)(ulong)uVar13,(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
        ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_34ec8,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&dStack_32678.ld,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)auStack_2fe28);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator*=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                      *)&fStack_2ad88,
                     (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                      *)auStack_34ec8);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator-((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&fStack_37718,&fStack_11a60);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (acStack_20c48,2,(type *)0x0);
        (anonymous_namespace)::
        power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)auStack_2fe28,(_anonymous_namespace_ *)acStack_20c48,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)(ulong)uVar13,(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
        ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_34ec8,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&dStack_32678.ld,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)auStack_2fe28);
        this_00 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&fStack_2d5d8;
      }
      else {
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator+((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&fStack_37718,&fStack_11a60);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (acStack_20c48,2,(type *)0x0);
        (anonymous_namespace)::
        power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)auStack_2fe28,(_anonymous_namespace_ *)acStack_20c48,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)(ulong)uVar13,(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
        ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_34ec8,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&dStack_32678.ld,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)auStack_2fe28);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator*=((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                      *)auStack_25ce8,
                     (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                      *)auStack_34ec8);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
        ::operator-((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
                     *)&dStack_32678.ld,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                     *)&fStack_37718,&fStack_11a60);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (acStack_20c48,2,(type *)0x0);
        (anonymous_namespace)::
        power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)auStack_2fe28,(_anonymous_namespace_ *)acStack_20c48,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)(ulong)uVar13,(uint)puVar17);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
        ::operator/((fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)auStack_34ec8,
                    (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                     *)&dStack_32678.ld,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)auStack_2fe28);
        this_00 = (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
                   *)&fStack_28538;
      }
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
      ::operator*=(this_00,(fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_128UL>
                            *)auStack_34ec8);
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (uVar21 < m);
  }
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)&dStack_32678.ld,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)auStack_25ce8,&fStack_28538);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+((promote<fvar<number<cpp_dec_float<100U>_>,_128UL>,_fvar<number<cpp_dec_float<100U,_int,_void>,_(expression_template_option)1>,_128UL>_>
               *)auStack_34ec8,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)&dStack_32678.ld,&fStack_2ad88);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
  ::operator+(&fStack_37718,
              (fvar<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,128ul>
               *)auStack_34ec8,&fStack_2d5d8);
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar15 = (long)this * m * 2 + 1;
  lVar20 = 0x48;
  do {
    if (lVar20 == 0x2898) {
      std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",0x81,0x81)
      ;
    }
    uStack_32648 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x38);
    uStack_32640 = *(undefined8 *)((long)(&nStack_37768.m_backend.data + 1) + lVar20);
    uStack_32658 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x28);
    uStack_32650 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x30);
    uStack_32668 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x18);
    uStack_32660 = *(undefined8 *)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x20);
    dStack_32678.la[0] =
         (limb_type)
         *(number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
           **)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 8);
    dStack_32678.ld.data =
         (limb_pointer)*(data_type **)((long)nStack_37768.m_backend.data._M_elems + lVar20 + 0x10);
    uStack_32638 = *(undefined4 *)((long)(&nStack_37768.m_backend.data + 1) + lVar20 + 8);
    uStack_32634 = *(undefined1 *)((long)(&nStack_37768.m_backend.data + 1) + lVar20 + 0xc);
    uStack_32630 = *(undefined8 *)
                    ((long)fStack_37718.v._M_elems[0].m_backend.data._M_elems + lVar20);
    auStack_142b0._0_8_ = &dStack_32678;
    auStack_142b0._8_8_ = 0.01;
    auStack_34eb0[6] = 0;
    auStack_34eb0[7] = 0;
    stack0xfffffffffffcb170 = 0;
    auStack_34eb0[2] = 0;
    auStack_34eb0[3] = 0;
    auStack_34eb0[4] = 0;
    auStack_34eb0[5] = 0;
    uStack_34eb8._0_4_ = 0;
    uStack_34eb8._4_4_ = 0;
    auStack_34eb0[0] = 0;
    auStack_34eb0[1] = 0;
    auStack_34ec8 = (undefined1  [8])0x0;
    plStack_34ec0 = (limb_type *)0x0;
    uStack_34e8b = 0;
    uStack_34e88._0_4_ = 0;
    uStack_34e88._4_1_ = false;
    uStack_34e80._0_4_ = cpp_dec_float_finite;
    uStack_34e80._4_4_ = 0x10;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,double,void,void>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                *)auStack_34ec8,
               (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_double,_void,_void>
                *)auStack_142b0,(add_immediates *)acStack_20c48);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                *)auStack_2fe28,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)auStack_34ec8,(type *)0x0);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>
    ::
    emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
              ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>>
                *)__return_storage_ptr__,
               (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)auStack_2fe28);
    if ((uStack_2fe14._1_1_ == '\0') && (cStack_2fe12 == '\0')) {
      operator_delete((void *)auStack_2fe28._8_8_,(auStack_2fe28._0_8_ & 0xffffffff) << 3);
    }
    uVar13 = (uint)puVar17;
    lVar20 = lVar20 + 0x50;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  pdVar22 = (data_type *)
            (__return_storage_ptr__->
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (data_type *)
           (__return_storage_ptr__->
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uStack_37798 = 0;
  uStack_37788 = 1;
  uStack_37784 = 0;
  cStack_37783 = '\x01';
  cStack_37782 = '\0';
  if (pdVar22 != pdVar4) {
    do {
      dStack_32678.la[0] =
           (limb_type)
           (number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
            *)&uStack_37798;
      dStack_32678.la[1] = (limb_type)pdVar22;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)&uStack_37798,
                 (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&dStack_32678.ld,(add_immediates *)auStack_2fe28);
      uVar13 = (uint)puVar17;
      pdVar22 = pdVar22 + 2;
    } while (pdVar22 != pdVar4);
  }
  uVar19 = uStack_34eb8;
  cVar11 = cStack_37782;
  auStack_34ec8 = (undefined1  [8])0x0;
  uStack_34eb8._7_1_ = SUB81(uVar19,7);
  uStack_34eb8._0_7_ =
       CONCAT16(cStack_37782,CONCAT15(cStack_37783,CONCAT14(uStack_37784,uStack_37788)));
  if (cStack_37783 == '\x01') {
    memcpy(auStack_34ec8,&uStack_37798,(ulong)uStack_37788 << 3);
  }
  else {
    auStack_34ec8 = (undefined1  [8])uStack_37798;
    plStack_34ec0 = plStack_37790;
    uStack_37788 = 0;
    cStack_37783 = '\x01';
  }
  if ((cStack_37783 == '\0') && (cVar11 == '\0')) {
    operator_delete(plStack_37790,(uStack_37798 & 0xffffffff) << 3);
  }
  auStack_2fe28._0_8_ = 2;
  uStack_2fe18 = 1;
  uStack_2fe14 = 0x100;
  cStack_2fe12 = '\0';
  (anonymous_namespace)::
  power_n<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&dStack_32678.ld,(_anonymous_namespace_ *)auStack_2fe28,
             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)(ulong)((type_conflict5)m * iVar12),uVar13);
  if (uStack_34eb8._4_1_ == uStack_32668._4_1_) {
    if ((uint)uStack_34eb8 == (uint)uStack_32668) {
      plVar18 = plStack_34ec0;
      if (uStack_34eb8._5_1_ != '\0') {
        plVar18 = (limb_type *)auStack_34ec8;
      }
      bVar25 = (uStack_34eb8 & 0xffffffff) == 0;
      if (bVar25) goto LAB_0010e415;
      uVar19 = &dStack_32678;
      if (uStack_32668._5_1_ == '\0') {
        uVar19 = dStack_32678.ld.data;
      }
      if (*plVar18 ==
          (((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
             *)&((limb_data *)uVar19)->capacity)->
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ).m_data.la[0]) {
        lVar15 = 8;
        do {
          bVar25 = (uStack_34eb8 & 0xffffffff) << 3 == lVar15;
          if (bVar25) goto LAB_0010e415;
          plVar1 = (long *)((long)plVar18 + lVar15);
          plVar2 = (long *)((long)&(((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                                      *)&((limb_data *)uVar19)->capacity)->
                                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   ).m_data + lVar15);
          lVar15 = lVar15 + 8;
        } while (*plVar1 == *plVar2);
      }
    }
  }
  bVar25 = false;
LAB_0010e415:
  if ((uStack_32668._5_1_ == '\0') && (uStack_32668._6_1_ == '\0')) {
    operator_delete(dStack_32678.ld.data,(dStack_32678.la[0] & 0xffffffff) << 3);
  }
  if ((uStack_2fe14._1_1_ == '\0') && (cStack_2fe12 == '\0')) {
    operator_delete((void *)auStack_2fe28._8_8_,(auStack_2fe28._0_8_ & 0xffffffff) << 3);
  }
  if (!bVar25) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: result check failed\n",0x1b);
    puVar16 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar16 = 0;
    __cxa_throw(puVar16,&int::typeinfo,0);
  }
  if ((uStack_34eb8._5_1_ == '\0') && (uStack_34eb8._6_1_ == '\0')) {
    operator_delete(plStack_34ec0,((ulong)auStack_34ec8 & 0xffffffff) << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<mp::cpp_int> finite(uint_t m, uint_t n) {
  typedef mp::number<mp::cpp_dec_float<Digits10, ExponentType>> real_type;
  std::cout << std::setprecision(std::numeric_limits<real_type>::max_digits10);

  auto const x = make_fvar<real_type, Order>(0);
  auto const xpo = make_fvar<real_type, Order>(-1);
  auto const xmo = make_fvar<real_type, Order>(+1);

  auto beta = 2 * x * xpo * xmo;
  auto beta_m = power_n(beta, m);
  auto c0 = power_n(xmo, m) + power_n(x * xpo, m);
  auto s0 = power_n(xmo, m) - power_n(x * xpo, m);
  auto cn = power_n(xpo, m) + power_n(x * xmo, m);
  auto sn = power_n(xpo, m) - power_n(x * xmo, m);

  auto z1 = zero(x);
  auto z2 = zero(x);
  auto z3 = zero(x);
  auto z4 = zero(x);
  if ((n & 1) == 0) {
    z1 = one(x) / 2;
    z2 = one(x) / 2;
    z3 = c0 * cn / 2;
    z4 = s0 * sn / 2;
  } else {
    z1 = cn / 2;
    z2 = sn / 2;
    z3 = c0 / 2;
    z4 = s0 / 2;
  }
  for (unsigned k = 1; k < n; ++k) {
    auto ak = alpha(x, beta, n, k);
    auto v = zero(x);
    for (unsigned j = 0; j <= m; j += 2)
      v += binomial_coefficient<real_type>(m, j)
        * power_n(ak * ak - beta * beta, j/2) * power_n(ak, m-j);
    if ((k & 1) == 1) {
      z1 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z2 *= (v - beta_m) / power_n(real_type(2), m - 1);
    } else {
      z3 *= (v + beta_m) / power_n(real_type(2), m - 1);
      z4 *= (v - beta_m) / power_n(real_type(2), m - 1);
    }
  }
  auto zmn = z1 + z2 + z3 + z4;

  std::vector<int_type> dos;
  for (unsigned i = 0; i <= 2 * m * n; ++i) dos.push_back(int_type(zmn.at(i) + 0.01));
  auto sum = std::accumulate(dos.begin(), dos.end(), int_type(0));
  if (sum != power_n(int_type(2), m * n)) {
    std::cerr << "Error: result check failed\n";
    throw(0);
  }
  return dos;
}